

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O0

int __thiscall QFile::rename(QFile *this,char *__old,char *__new)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  int iVar6;
  FileError FVar7;
  uint uVar8;
  QFilePrivate *this_00;
  pointer pQVar9;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src_00;
  long in_FS_OFFSET;
  int attempt;
  bool changingCase;
  QFilePrivate *d;
  QFile out;
  QSystemError error2;
  QSystemError error;
  QTemporaryFileName tfn;
  QByteArray fileId;
  QByteArray targetId;
  QFileSystemEntry tmp;
  QFileSystemEntry src;
  undefined4 in_stack_fffffffffffffa78;
  CaseSensitivity in_stack_fffffffffffffa7c;
  enum_type in_stack_fffffffffffffa80;
  enum_type in_stack_fffffffffffffa84;
  QFileSystemEntry *in_stack_fffffffffffffa88;
  QFlagsStorage<QFileDevice::Permission> permissions;
  QMessageLogger *in_stack_fffffffffffffa90;
  undefined6 in_stack_fffffffffffffa98;
  undefined1 in_stack_fffffffffffffa9e;
  undefined1 in_stack_fffffffffffffa9f;
  QTemporaryFileName *in_stack_fffffffffffffaa0;
  undefined7 in_stack_fffffffffffffaa8;
  undefined1 in_stack_fffffffffffffaaf;
  QChar in_stack_ffffffffffffface;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaec;
  QTemporaryFileName *in_stack_fffffffffffffaf0;
  QSystemError *in_stack_fffffffffffffaf8;
  undefined5 in_stack_fffffffffffffb00;
  undefined1 in_stack_fffffffffffffb05;
  byte in_stack_fffffffffffffb06;
  undefined1 in_stack_fffffffffffffb07;
  QFileSystemEntry *in_stack_fffffffffffffb08;
  int local_4a8;
  int local_4a4;
  EVP_PKEY_CTX *__filename;
  undefined1 local_471;
  QChar local_43a [64];
  QChar local_3ba [99];
  undefined2 local_2f4;
  QChar local_2f2 [49];
  QSystemError local_290 [4];
  QSystemError local_270;
  undefined1 *local_268;
  undefined1 *puStack_260;
  undefined1 *local_258;
  undefined1 *puStack_250;
  undefined1 *local_248;
  undefined1 *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  undefined1 *puStack_200;
  undefined1 *local_1f8;
  QMessageLogger local_1c0;
  undefined1 local_1a0 [168];
  undefined1 *local_f8;
  undefined1 *puStack_f0;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  undefined1 *local_c8;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QFile *)0x2a3751);
  (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0x1d])(local_1a0);
  bVar1 = QString::isEmpty((QString *)0x2a377f);
  QString::~QString((QString *)0x2a3793);
  if (bVar1) {
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88,in_stack_fffffffffffffa84
               ,(char *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
    QMessageLogger::warning(&local_1c0,"QFile::rename: Empty or null file name");
    local_471 = 0;
    goto LAB_002a4b66;
  }
  bVar1 = ::operator==((QString *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                       (QString *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
  if (bVar1) {
    tr((char *)in_stack_fffffffffffffa88,
       (char *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
       in_stack_fffffffffffffa7c);
    QFileDevicePrivate::setError
              ((QFileDevicePrivate *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               in_stack_fffffffffffffa7c,(QString *)0x2a384d);
    QString::~QString((QString *)0x2a385c);
    local_471 = 0;
    goto LAB_002a4b66;
  }
  bVar1 = exists((QFile *)in_stack_fffffffffffffa90);
  if (!bVar1) {
    tr((char *)in_stack_fffffffffffffa88,
       (char *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
       in_stack_fffffffffffffa7c);
    QFileDevicePrivate::setError
              ((QFileDevicePrivate *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               in_stack_fffffffffffffa7c,(QString *)0x2a38f7);
    QString::~QString((QString *)0x2a3906);
    local_471 = 0;
    goto LAB_002a4b66;
  }
  local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
  local_208 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_200 = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::QFileSystemEntry
            ((QFileSystemEntry *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
             (QString *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
  QFileSystemEngine::id
            ((QFileSystemEntry *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
  QFileSystemEntry::~QFileSystemEntry
            ((QFileSystemEntry *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
  bVar1 = QByteArray::isNull((QByteArray *)0x2a39b4);
  if (bVar1) {
    QFileDevice::unsetError
              ((QFileDevice *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
    (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xe])();
    FVar7 = QFileDevice::error((QFileDevice *)
                               CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
    if (FVar7 == NoError) {
      iVar6 = (*(this_00->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
                super_QObjectData._vptr_QObjectData[7])();
      bVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0x60))
                        ((long *)CONCAT44(extraout_var,iVar6),__old);
      if ((bVar3 & 1) == 0) {
        uVar8 = (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xc])();
        if ((uVar8 & 1) == 0) {
          __filename = (EVP_PKEY_CTX *)__old;
          uVar8 = QFilePrivate::copy(this_00,(EVP_PKEY_CTX *)__old,src_00);
          uVar4 = (undefined1)uVar8;
          if ((uVar8 & 1) == 0) {
            QIODevice::errorString((QIODevice *)this_00);
            QFileDevicePrivate::setError
                      ((QFileDevicePrivate *)
                       CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                       in_stack_fffffffffffffa7c,(QString *)0x2a4afb);
            QString::~QString((QString *)0x2a4b0a);
            goto LAB_002a4b35;
          }
          uVar8 = remove(this,__old);
          uVar5 = (undefined1)uVar8;
          if ((uVar8 & 1) == 0) {
            tr((char *)in_stack_fffffffffffffa88,
               (char *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               in_stack_fffffffffffffa7c);
            iVar6 = (int)((ulong)this_00 >> 0x20);
            QIODevice::errorString((QIODevice *)in_stack_fffffffffffffa88);
            permissions.i = (Int)((ulong)in_stack_fffffffffffffa88 >> 0x20);
            QChar::QChar<char16_t,_true>(local_43a,L' ');
            QString::arg<QString,_true>
                      ((QString *)in_stack_fffffffffffffaa0,
                       (QString *)CONCAT17(uVar4,CONCAT16(uVar5,in_stack_fffffffffffffa98)),iVar6,
                       in_stack_ffffffffffffface);
            QFileDevicePrivate::setError
                      ((QFileDevicePrivate *)
                       CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                       in_stack_fffffffffffffa7c,(QString *)0x2a4904);
            QString::~QString((QString *)0x2a4913);
            QString::~QString((QString *)0x2a4920);
            QString::~QString((QString *)0x2a492d);
            QFile((QFile *)in_stack_fffffffffffffaa0,
                  (QString *)CONCAT17(uVar4,CONCAT16(uVar5,in_stack_fffffffffffffa98)));
            ::operator|(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80);
            setPermissions((QFile *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                           (Permissions)permissions.i);
            remove((char *)__filename);
            local_471 = 0;
            ~QFile((QFile *)0x2a49ae);
          }
          else {
            pQVar9 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                     ::operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                                   *)0x2a4a69);
            (*pQVar9->_vptr_QAbstractFileEngine[0x1e])(pQVar9,__filename);
            QFileDevice::unsetError
                      ((QFileDevice *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80))
            ;
            setFileName((QFile *)in_stack_fffffffffffffa90,&in_stack_fffffffffffffa88->m_filePath);
            local_471 = 1;
          }
        }
        else {
          tr((char *)in_stack_fffffffffffffa88,
             (char *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
             in_stack_fffffffffffffa7c);
          QFileDevicePrivate::setError
                    ((QFileDevicePrivate *)
                     CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                     in_stack_fffffffffffffa7c,(QString *)0x2a47d4);
          QString::~QString((QString *)0x2a47e3);
          local_471 = 0;
        }
      }
      else {
        QFileDevice::unsetError
                  ((QFileDevice *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
        pQVar9 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
                 operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                             *)0x2a467f);
        (*pQVar9->_vptr_QAbstractFileEngine[0x1e])(pQVar9,__old);
        QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                           (QString *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78))
        ;
        local_471 = 1;
      }
    }
    else {
LAB_002a4b35:
      local_471 = 0;
    }
  }
  else {
    local_220 = &DAT_aaaaaaaaaaaaaaaa;
    local_218 = &DAT_aaaaaaaaaaaaaaaa;
    local_210 = &DAT_aaaaaaaaaaaaaaaa;
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *
                       )0x2a39fd);
    if (bVar1) {
      pQVar9 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
               operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                           *)0x2a3a1f);
      (*pQVar9->_vptr_QAbstractFileEngine[0x18])(&local_220);
    }
    else {
      QFileSystemEntry::QFileSystemEntry
                ((QFileSystemEntry *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                 (QString *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
      QFileSystemEngine::id
                ((QFileSystemEntry *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
      QFileSystemEntry::~QFileSystemEntry
                ((QFileSystemEntry *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
    }
    bVar2 = ::operator==((QByteArray *)in_stack_fffffffffffffa90,
                         (QByteArray *)in_stack_fffffffffffffa88);
    bVar1 = false;
    if (bVar2) {
      iVar6 = QString::compare(&in_stack_fffffffffffffa88->m_filePath,
                               (QString *)
                               CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                               in_stack_fffffffffffffa7c);
      bVar1 = iVar6 == 0;
    }
    if (bVar1) {
      local_268 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_260 = &DAT_aaaaaaaaaaaaaaaa;
      local_258 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_250 = &DAT_aaaaaaaaaaaaaaaa;
      local_248 = &DAT_aaaaaaaaaaaaaaaa;
      QTemporaryFileName::QTemporaryFileName
                (in_stack_fffffffffffffaf0,
                 (QString *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
      local_b8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
      QFileSystemEntry::QFileSystemEntry
                ((QFileSystemEntry *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                 (QString *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
      local_270 = (QSystemError)&DAT_aaaaaaaaaaaaaaaa;
      QSystemError::QSystemError(&local_270);
      for (local_4a8 = 0; iVar6 = (int)((ulong)in_stack_fffffffffffffa90 >> 0x20), local_4a8 < 0x10;
          local_4a8 = local_4a8 + 1) {
        local_c8 = &DAT_aaaaaaaaaaaaaaaa;
        local_d8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
        local_e8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
        local_f8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
        QTemporaryFileName::generateNext(in_stack_fffffffffffffaa0);
        QFileSystemEntry::QFileSystemEntry
                  (in_stack_fffffffffffffa88,
                   (NativePath *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                   SUB81((ulong)in_stack_fffffffffffffa90 >> 0x38,0));
        QByteArray::~QByteArray((QByteArray *)0x2a3d95);
        in_stack_fffffffffffffb07 =
             QFileSystemEngine::renameFile
                       (in_stack_fffffffffffffb08,
                        (QFileSystemEntry *)
                        CONCAT17(in_stack_fffffffffffffb07,
                                 CONCAT16(in_stack_fffffffffffffb06,
                                          CONCAT15(in_stack_fffffffffffffb05,
                                                   in_stack_fffffffffffffb00))),
                        in_stack_fffffffffffffaf8);
        if ((bool)in_stack_fffffffffffffb07) {
          QFileSystemEntry::QFileSystemEntry
                    ((QFileSystemEntry *)
                     CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                     (QString *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          in_stack_fffffffffffffb06 =
               QFileSystemEngine::renameFile
                         (in_stack_fffffffffffffb08,
                          (QFileSystemEntry *)
                          CONCAT17(in_stack_fffffffffffffb07,
                                   CONCAT16(in_stack_fffffffffffffb06,
                                            CONCAT15(in_stack_fffffffffffffb05,
                                                     in_stack_fffffffffffffb00))),
                          in_stack_fffffffffffffaf8);
          QFileSystemEntry::~QFileSystemEntry
                    ((QFileSystemEntry *)
                     CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
          if ((in_stack_fffffffffffffb06 & 1) == 0) {
            local_290[0] = (QSystemError)&DAT_aaaaaaaaaaaaaaaa;
            in_stack_fffffffffffffaf8 = local_290;
            QSystemError::QSystemError(in_stack_fffffffffffffaf8);
            in_stack_fffffffffffffb05 =
                 QFileSystemEngine::renameFile
                           (in_stack_fffffffffffffb08,
                            (QFileSystemEntry *)
                            CONCAT17(in_stack_fffffffffffffb07,
                                     CONCAT16(in_stack_fffffffffffffb06,
                                              CONCAT15(in_stack_fffffffffffffb05,
                                                       in_stack_fffffffffffffb00))),
                            in_stack_fffffffffffffaf8);
            if ((bool)in_stack_fffffffffffffb05) {
              local_4a4 = 2;
            }
            else {
              tr((char *)in_stack_fffffffffffffa88,
                 (char *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                 in_stack_fffffffffffffa7c);
              QSystemError::toString
                        ((QSystemError *)
                         CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
              QChar::QChar<char16_t,_true>(local_2f2,L' ');
              QString::arg<QString,_true>
                        ((QString *)in_stack_fffffffffffffaa0,
                         (QString *)
                         CONCAT17(in_stack_fffffffffffffa9f,
                                  CONCAT16(in_stack_fffffffffffffa9e,in_stack_fffffffffffffa98)),
                         (int)((ulong)in_stack_fffffffffffffa90 >> 0x20),in_stack_ffffffffffffface);
              local_2f4 = 10;
              ::operator+(&in_stack_fffffffffffffa88->m_filePath,
                          (char16_t *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80))
              ;
              tr((char *)in_stack_fffffffffffffa88,
                 (char *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                 in_stack_fffffffffffffa7c);
              QFileSystemEntry::filePath(in_stack_fffffffffffffa88);
              QDir::toNativeSeparators
                        ((QString *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
              QSystemError::toString
                        ((QSystemError *)
                         CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
              QString::arg<QString,QString>
                        ((QString *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
                         (QString *)in_stack_fffffffffffffaa0,
                         (QString *)
                         CONCAT17(in_stack_fffffffffffffa9f,
                                  CONCAT16(in_stack_fffffffffffffa9e,in_stack_fffffffffffffa98)));
              ::operator+((QStringBuilder<QString,_char16_t> *)in_stack_fffffffffffffa88,
                          (QString *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
              ::QStringBuilder::operator_cast_to_QString
                        ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)
                         CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
              QFileDevicePrivate::setError
                        ((QFileDevicePrivate *)
                         CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                         in_stack_fffffffffffffa7c,(QString *)0x2a412c);
              QString::~QString((QString *)0x2a413b);
              QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder
                        ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)
                         CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
              QString::~QString((QString *)0x2a4155);
              QString::~QString((QString *)0x2a4162);
              QString::~QString((QString *)0x2a416f);
              QString::~QString((QString *)0x2a417c);
              QString::~QString((QString *)0x2a4189);
              QStringBuilder<QString,_char16_t>::~QStringBuilder
                        ((QStringBuilder<QString,_char16_t> *)0x2a4196);
              QString::~QString((QString *)0x2a41a3);
              QString::~QString((QString *)0x2a41b0);
              QString::~QString((QString *)0x2a41bd);
              local_471 = 0;
              local_4a4 = 1;
            }
          }
          else {
            pQVar9 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                     ::operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                                   *)0x2a3ecb);
            (*pQVar9->_vptr_QAbstractFileEngine[0x1e])(pQVar9,__old);
            QString::operator=((QString *)
                               CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                               (QString *)
                               CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
            local_471 = 1;
            local_4a4 = 1;
          }
        }
        else {
          local_4a4 = 4;
        }
        QFileSystemEntry::~QFileSystemEntry
                  ((QFileSystemEntry *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80)
                  );
        iVar6 = (int)((ulong)in_stack_fffffffffffffa90 >> 0x20);
        if (local_4a4 == 2) break;
        if (local_4a4 != 4) goto LAB_002a4535;
      }
      tr((char *)in_stack_fffffffffffffa88,
         (char *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
         in_stack_fffffffffffffa7c);
      QSystemError::toString
                ((QSystemError *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
      QChar::QChar<char16_t,_true>(local_3ba,L' ');
      QString::arg<QString,_true>
                ((QString *)in_stack_fffffffffffffaa0,
                 (QString *)
                 CONCAT17(in_stack_fffffffffffffa9f,
                          CONCAT16(in_stack_fffffffffffffa9e,in_stack_fffffffffffffa98)),iVar6,
                 in_stack_ffffffffffffface);
      QFileDevicePrivate::setError
                ((QFileDevicePrivate *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80)
                 ,in_stack_fffffffffffffa7c,(QString *)0x2a4482);
      QString::~QString((QString *)0x2a4491);
      QString::~QString((QString *)0x2a449e);
      QString::~QString((QString *)0x2a44ab);
      local_471 = 0;
LAB_002a4535:
      QFileSystemEntry::~QFileSystemEntry
                ((QFileSystemEntry *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
      QTemporaryFileName::~QTemporaryFileName((QTemporaryFileName *)0x2a454f);
    }
    else {
      tr((char *)in_stack_fffffffffffffa88,
         (char *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
         in_stack_fffffffffffffa7c);
      QFileDevicePrivate::setError
                ((QFileDevicePrivate *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80)
                 ,in_stack_fffffffffffffa7c,(QString *)0x2a3b4b);
      QString::~QString((QString *)0x2a3b5a);
      local_471 = 0;
    }
    QByteArray::~QByteArray((QByteArray *)0x2a457a);
  }
  QByteArray::~QByteArray((QByteArray *)0x2a4b55);
LAB_002a4b66:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (uint)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_471) & 0xffffff01
    ;
  }
  __stack_chk_fail();
}

Assistant:

bool
QFile::rename(const QString &newName)
{
    Q_D(QFile);

    // if this is a QTemporaryFile, the virtual fileName() call here may do something
    if (fileName().isEmpty()) {
        qWarning("QFile::rename: Empty or null file name");
        return false;
    }
    if (d->fileName == newName) {
        d->setError(QFile::RenameError, tr("Destination file is the same file."));
        return false;
    }
    if (!exists()) {
        d->setError(QFile::RenameError, tr("Source file does not exist."));
        return false;
    }

    // If the file exists and it is a case-changing rename ("foo" -> "Foo"),
    // compare Ids to make sure it really is a different file.
    // Note: this does not take file engines into account.
    bool changingCase = false;
    QByteArray targetId = QFileSystemEngine::id(QFileSystemEntry(newName));
    if (!targetId.isNull()) {
        QByteArray fileId = d->fileEngine ?
                    d->fileEngine->id() :
                    QFileSystemEngine::id(QFileSystemEntry(d->fileName));
        changingCase = (fileId == targetId && d->fileName.compare(newName, Qt::CaseInsensitive) == 0);
        if (!changingCase) {
            d->setError(QFile::RenameError, tr("Destination file exists"));
            return false;
        }

#if defined(Q_OS_LINUX) && QT_CONFIG(temporaryfile)
        // rename() on Linux simply does nothing when renaming "foo" to "Foo" on a case-insensitive
        // FS, such as FAT32. Move the file away and rename in 2 steps to work around.
        QTemporaryFileName tfn(d->fileName);
        QFileSystemEntry src(d->fileName);
        QSystemError error;
        for (int attempt = 0; attempt < 16; ++attempt) {
            QFileSystemEntry tmp(tfn.generateNext(), QFileSystemEntry::FromNativePath());

            // rename to temporary name
            if (!QFileSystemEngine::renameFile(src, tmp, error))
                continue;

            // rename to final name
            if (QFileSystemEngine::renameFile(tmp, QFileSystemEntry(newName), error)) {
                d->fileEngine->setFileName(newName);
                d->fileName = newName;
                return true;
            }

            // We need to restore the original file.
            QSystemError error2;
            if (QFileSystemEngine::renameFile(tmp, src, error2))
                break;      // report the original error, below

            // report both errors
            d->setError(QFile::RenameError,
                        tr("Error while renaming: %1").arg(error.toString())
                        + u'\n'
                        + tr("Unable to restore from %1: %2").
                        arg(QDir::toNativeSeparators(tmp.filePath()), error2.toString()));
            return false;
        }
        d->setError(QFile::RenameError,
                    tr("Error while renaming: %1").arg(error.toString()));
        return false;
#endif // Q_OS_LINUX
    }
    unsetError();
    close();
    if (error() == QFile::NoError) {
        if (changingCase ? d->engine()->renameOverwrite(newName) : d->engine()->rename(newName)) {
            unsetError();
            // engine was able to handle the new name so we just reset it
            d->fileEngine->setFileName(newName);
            d->fileName = newName;
            return true;
        }

        // Engine was unable to rename and the fallback will delete the original file,
        // so we have to back out here on case-insensitive file systems:
        if (changingCase) {
            d->setError(QFile::RenameError, d->fileEngine->errorString());
            return false;
        }

        if (isSequential()) {
            d->setError(QFile::RenameError, tr("Will not rename sequential file using block copy"));
            return false;
        }

#if QT_CONFIG(temporaryfile)
        // copy the file to the destination first
        if (d->copy(newName)) {
            // succeeded, remove the original
            if (!remove()) {
                d->setError(QFile::RenameError, tr("Cannot remove source file: %1").arg(errorString()));
                QFile out(newName);
                // set it back to writable so we can delete it
                out.setPermissions(ReadUser | WriteUser);
                out.remove(newName);
                return false;
            }
            d->fileEngine->setFileName(newName);
            unsetError();
            setFileName(newName);
            return true;
        } else {
            // change the error type but keep the string
            d->setError(QFile::RenameError, errorString());
        }
#else
        // copy the error from the engine rename() above
        d->setError(QFile::RenameError, d->fileEngine->errorString());
#endif
    }
    return false;
}